

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcones2qc.h
# Opt level: O1

Context __thiscall
mp::
QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Convert(QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,ItemType *ac,int param_2)

{
  CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  *v1;
  pointer __src;
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  double dVar4;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar5;
  undefined8 uVar6;
  double *coef;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  NodeRange NVar10;
  Arguments x0;
  Parameters c;
  QuadConLE qc;
  vector<int,_std::allocator<int>_> local_cf0;
  vector<double,_std::allocator<double>_> local_cd8;
  double local_cc0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_cb8;
  double local_ad8;
  undefined8 uStack_ad0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_ac8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_8e8;
  LinTerms local_708;
  LinTerms local_688;
  QuadTerms local_610;
  QuadTerms local_4d0;
  QuadAndLinTerms local_390;
  QuadAndLinTerms local_1d8;
  
  v1 = &ac->
        super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
  ;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_cd8,
             &(ac->
              super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
              ).params_);
  for (pdVar7 = local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar7 != local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
    *pdVar7 = *pdVar7 * *pdVar7;
  }
  local_ad8 = *local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
  uStack_ad0 = 0;
  *local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = -local_ad8;
  pFVar5 = &((this->
             super_BasicFuncConstrCvt<mp::QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             ).
             super_BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            .mdl_cvt_)->
            super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ;
  var = *(v1->args_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  dVar4 = (pFVar5->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[var];
  pdVar7 = (pFVar5->super_FlatModel<mp::DefaultFlatModelParams>).var_ub_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start + var;
  if ((dVar4 != *pdVar7) || (NAN(dVar4) || NAN(*pdVar7))) {
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::NarrowVarBounds(pFVar5,var,0.0,INFINITY);
    local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[0]
         = (type)0x0;
    local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[5]
         = (type)0x0;
    local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[1]
         = (type)0x0;
    local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[2]
         = (type)0x0;
    local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3]
         = (type)0x0;
    local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[4]
         = (type)0x0;
    local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[0] =
         (type)0x0;
    local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[1] =
         (type)0x0;
    local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[2] =
         (type)0x0;
    local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[3] =
         (type)0x0;
    local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[4] =
         (type)0x0;
    local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[5] =
         (type)0x0;
    local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage
    ;
    local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    QuadTerms::QuadTerms(&local_4d0,&local_cd8,&v1->args_,&v1->args_);
    QuadAndLinTerms::QuadAndLinTerms(&local_1d8,&local_688,&local_4d0);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&local_cb8,&local_1d8,(AlgConRhs<_1>)0x0,true);
    if (6 < local_1d8.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1d8.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1d8.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1d8.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1d8.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1d8.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1d8.super_QuadTerms.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>
            .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1d8.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1d8.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_1d8.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_1d8.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_1d8.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_1d8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1d8.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1d8.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1d8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1d8.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1d8.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (6 < local_4d0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_4d0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_4d0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_4d0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_4d0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_4d0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_4d0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_4d0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_4d0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_4d0.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_4d0.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_4d0.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_688.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_688.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    pFVar5 = &((this->
               super_BasicFuncConstrCvt<mp::QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              .mdl_cvt_)->
              super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ;
    paVar3 = &local_8e8.super_BasicConstraint.name_.field_2;
    paVar2 = &local_cb8.super_BasicConstraint.name_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cb8.super_BasicConstraint.name_._M_dataplus._M_p == paVar2) {
      local_8e8.super_BasicConstraint.name_.field_2._8_8_ =
           local_cb8.super_BasicConstraint.name_.field_2._8_8_;
      local_8e8.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_8e8.super_BasicConstraint.name_._M_dataplus._M_p =
           local_cb8.super_BasicConstraint.name_._M_dataplus._M_p;
    }
    local_8e8.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_ =
         local_cb8.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_;
    local_8e8.super_BasicConstraint.name_.field_2._M_local_buf[0] =
         local_cb8.super_BasicConstraint.name_.field_2._M_local_buf[0];
    local_8e8.super_BasicConstraint.name_._M_string_length =
         local_cb8.super_BasicConstraint.name_._M_string_length;
    local_cb8.super_BasicConstraint.name_._M_string_length = 0;
    local_cb8.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
    local_cb8.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar2;
    if (local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_8e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_8e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
      local_8e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      if (local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_8e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_8e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
           super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_8e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
           local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
           super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    }
    if (local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_8e8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_8e8.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
      local_8e8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if (local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_8e8.super_QuadAndLinTerms.super_LinTerms.vars_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_8e8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_8e8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    }
    if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
        m_capacity < 9) {
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_data_ptr = (ptr)((long)&local_8e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                                .m_data + 0x18);
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_capacity = 8;
      if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_size != 0) {
        lVar9 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)&(local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                            .m_data.
                            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                           .m_data_ptr)->first + lVar9);
          uVar6 = puVar1[1];
          *(undefined8 *)
           ((long)&(local_8e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                   .m_data_ptr)->first + lVar9) = *puVar1;
          *(undefined8 *)
           ((long)&local_8e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                   super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                   .m_data + lVar9 + 0x20) = uVar6;
          lVar9 = lVar9 + 0x10;
        } while (local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                 .m_data.
                 super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                 .m_size << 4 != lVar9);
      }
    }
    else {
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_data_ptr = local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                   super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                   .m_data.
                   super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                   .m_data_ptr;
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_capacity = local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                   super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                   .m_data.
                   super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                   .m_capacity;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_capacity = 8;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size =
           0;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_data_ptr = (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                                .m_data + 0x18);
    }
    if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_8e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_8e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
           super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
           super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    }
    if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    }
    if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    }
    local_8e8.super_AlgConRhs<_1>.rhs_ = local_cb8.super_AlgConRhs<_1>.rhs_;
    NVar10 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::
             AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                         *)pFVar5,&local_8e8);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink(pFVar5,NVar10);
    if (6 < local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_8e8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_8e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_8e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_8e8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_8e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_8e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_8e8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_8e8.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_8e8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_8e8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_8e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_8e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_8e8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8.super_BasicConstraint.name_._M_dataplus._M_p != paVar3) {
      operator_delete(local_8e8.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_8e8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if (6 < local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cb8.super_BasicConstraint.name_._M_dataplus._M_p == paVar2) goto LAB_003ce50d;
    uVar8 = CONCAT71(local_cb8.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_,
                     local_cb8.super_BasicConstraint.name_.field_2._M_local_buf[0]) + 1;
    local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_cb8.super_BasicConstraint.name_._M_dataplus._M_p;
  }
  else {
    pdVar7 = local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
    local_cc0 = dVar4;
    if (pdVar7 != local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      memmove(local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,pdVar7,
              (long)local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar7);
    }
    local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
    std::vector<int,_std::allocator<int>_>::vector(&local_cf0,&v1->args_);
    __src = (pointer)((long)local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 4);
    if (__src != local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      memmove(local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start,__src,
              (long)local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src);
    }
    local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
    local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[0]
         = (type)0x0;
    local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[5]
         = (type)0x0;
    local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[1]
         = (type)0x0;
    local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[2]
         = (type)0x0;
    local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[3]
         = (type)0x0;
    local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data[4]
         = (type)0x0;
    local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[0] =
         (type)0x0;
    local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[1] =
         (type)0x0;
    local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[2] =
         (type)0x0;
    local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[3] =
         (type)0x0;
    local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[4] =
         (type)0x0;
    local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage.m_data[5] =
         (type)0x0;
    local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage
    ;
    local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    QuadTerms::QuadTerms(&local_610,&local_cd8,&local_cf0,&local_cf0);
    QuadAndLinTerms::QuadAndLinTerms(&local_390,&local_708,&local_610);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&local_cb8,&local_390,(AlgConRhs<_1>)(local_ad8 * local_cc0),true);
    if (6 < local_390.super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_390.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_390.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_390.super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_390.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_390.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_390.super_QuadTerms.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>
            .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_390.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_390.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_390.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_390.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_390.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_390.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_390.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_390.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_390.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
            m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_390.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_390.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (6 < local_610.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_610.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_610.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_610.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_610.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_610.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_610.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_610.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_610.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_610.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_610.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_610.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_708.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_708.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    pFVar5 = &((this->
               super_BasicFuncConstrCvt<mp::QConeConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              .mdl_cvt_)->
              super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ;
    paVar3 = &local_ac8.super_BasicConstraint.name_.field_2;
    paVar2 = &local_cb8.super_BasicConstraint.name_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cb8.super_BasicConstraint.name_._M_dataplus._M_p == paVar2) {
      local_ac8.super_BasicConstraint.name_.field_2._8_8_ =
           local_cb8.super_BasicConstraint.name_.field_2._8_8_;
      local_ac8.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_ac8.super_BasicConstraint.name_._M_dataplus._M_p =
           local_cb8.super_BasicConstraint.name_._M_dataplus._M_p;
    }
    local_ac8.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_ =
         local_cb8.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_;
    local_ac8.super_BasicConstraint.name_.field_2._M_local_buf[0] =
         local_cb8.super_BasicConstraint.name_.field_2._M_local_buf[0];
    local_ac8.super_BasicConstraint.name_._M_string_length =
         local_cb8.super_BasicConstraint.name_._M_string_length;
    local_cb8.super_BasicConstraint.name_._M_string_length = 0;
    local_cb8.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
    local_cb8.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar2;
    if (local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_ac8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_ac8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
      local_ac8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      if (local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_ac8.super_QuadAndLinTerms.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_ac8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
           super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_ac8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
           local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
           super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    }
    if (local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_ac8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_ac8.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
      local_ac8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if (local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_ac8.super_QuadAndLinTerms.super_LinTerms.vars_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_ac8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_ac8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    }
    if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
        m_capacity < 9) {
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_data_ptr = (ptr)((long)&local_ac8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                                .m_data + 0x18);
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_capacity = 8;
      if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_size != 0) {
        lVar9 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)&(local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                            .m_data.
                            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                           .m_data_ptr)->first + lVar9);
          uVar6 = puVar1[1];
          *(undefined8 *)
           ((long)&(local_ac8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                   .m_data_ptr)->first + lVar9) = *puVar1;
          *(undefined8 *)
           ((long)&local_ac8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                   super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                   .m_data + lVar9 + 0x20) = uVar6;
          lVar9 = lVar9 + 0x10;
        } while (local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                 super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                 .m_data.
                 super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                 .m_size << 4 != lVar9);
      }
    }
    else {
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_data_ptr = local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                   super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                   .m_data.
                   super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                   .m_data_ptr;
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_capacity = local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                   super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                   .m_data.
                   super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                   .m_capacity;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_capacity = 8;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size =
           0;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
      m_data_ptr = (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                                .m_data + 0x18);
    }
    if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_ac8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
        memcpy(local_ac8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
      }
    }
    else {
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
           super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
           super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    }
    if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    }
    if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
        super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if (local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
        memcpy(local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.
               super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
      }
    }
    else {
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
      local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
           local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
           super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
      super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    }
    local_ac8.super_AlgConRhs<_1>.rhs_ = local_cb8.super_AlgConRhs<_1>.rhs_;
    NVar10 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::
             AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                         *)pFVar5,&local_ac8);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink(pFVar5,NVar10);
    if (6 < local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_ac8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_ac8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_ac8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_ac8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_ac8.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_ac8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_ac8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_ac8.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_ac8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_ac8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_ac8.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_ac8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_ac8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ac8.super_BasicConstraint.name_._M_dataplus._M_p != paVar3) {
      operator_delete(local_ac8.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_ac8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if (6 < local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_cb8.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cb8.super_BasicConstraint.name_._M_dataplus._M_p != paVar2) {
      operator_delete(local_cb8.super_BasicConstraint.name_._M_dataplus._M_p,
                      CONCAT71(local_cb8.super_BasicConstraint.name_.field_2._M_allocated_capacity.
                               _1_7_,local_cb8.super_BasicConstraint.name_.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_003ce50d;
    uVar8 = (long)local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  operator_delete(local_cf0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,uVar8);
LAB_003ce50d:
  if (local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_cd8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (Context)CTX_ROOT;
}

Assistant:

Context Convert(const ItemType& ac, int ) {
    const auto& x = ac.GetArguments();
    auto c = ac.GetParameters();
    for (auto& coef: c)
      coef *= coef;
    c[0] = -c[0];
    if (!GetMC().is_fixed(x[0])) {
      GetMC().NarrowVarBounds(x[0], 0.0, GetMC().Infty());
      auto qc {QuadConLE{ {{}, {c, x, x}}, {0.0} }};
      GetMC().AddConstraint(std::move(qc));
    } else {
      // Reproduce fixed RHS, better for Mosek & COPT. conic/socp_10
      auto rhs = -c[0] * GetMC().fixed_value(x[0]);
      c.erase(c.begin());
      auto x0 = x;
      x0.erase(x0.begin());
      auto qc {QuadConLE{ {{}, {c, x0, x0}}, {rhs} }};
      GetMC().AddConstraint(std::move(qc));
    }
    return Context::CTX_ROOT;
  }